

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipoleSum.cpp
# Opt level: O1

void __thiscall
OpenMD::MultipoleSum::MultipoleSum
          (MultipoleSum *this,SimInfo *info,string *filename,string *sele1,RealType rmax,int nrbins)

{
  SelectionEvaluator *this_00;
  pointer pcVar1;
  pointer pdVar2;
  long *plVar3;
  pointer pOVar4;
  long lVar5;
  undefined1 local_a0 [24];
  long lStack_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  vector<double,_std::allocator<double>_> *local_78;
  vector<double,_std::allocator<double>_> *local_70;
  vector<double,_std::allocator<double>_> *local_68;
  vector<double,_std::allocator<double>_> *local_60;
  string *local_58;
  string local_50;
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,nrbins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__MultipoleSum_0033acb0;
  this->nRBins_ = (long)nrbins;
  this->rMax_ = rmax;
  local_60 = &this->aveQlength_;
  local_68 = &this->aveDcount_;
  local_70 = &this->aveQcount_;
  local_78 = &this->aveDproj_;
  local_80 = &(this->selectionScript1_).field_2;
  (this->aveDlength_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aveDlength_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aveDlength_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->aveQlength_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aveQlength_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aveQlength_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->aveDcount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aveDcount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aveDcount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->aveQcount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aveQcount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aveQcount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->aveDproj_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aveDproj_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aveDproj_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->selectionScript1_)._M_dataplus._M_p = (pointer)local_80;
  pcVar1 = (sele1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->selectionScript1_,pcVar1,pcVar1 + sele1->_M_string_length);
  local_58 = &this->selectionScript1_;
  SelectionManager::SelectionManager(&this->seleMan1_,info);
  this_00 = &this->evaluator1_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  getPrefix(&local_50,filename);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  pOVar4 = (pointer)(plVar3 + 2);
  if ((pointer)*plVar3 == pOVar4) {
    local_a0._16_8_ =
         (pOVar4->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    lStack_88 = plVar3[3];
    local_a0._0_8_ = (pointer)(local_a0 + 0x10);
  }
  else {
    local_a0._16_8_ =
         (pOVar4->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    local_a0._0_8_ = (pointer)*plVar3;
  }
  local_a0._8_8_ = plVar3[1];
  *plVar3 = (long)pOVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  if ((pointer)local_a0._0_8_ != (pointer)(local_a0 + 0x10)) {
    operator_delete((void *)local_a0._0_8_,
                    (ulong)((long)&(((vector<bool,_std::allocator<bool>_> *)local_a0._16_8_)->
                                   super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  SelectionEvaluator::loadScriptString(this_00,sele1);
  if ((this->evaluator1_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)local_a0,this_00);
    lVar5 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan1_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar5),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((vector<bool,_std::allocator<bool>_> *)local_a0._0_8_)->
                         super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar5));
      lVar5 = lVar5 + 0x28;
    } while (lVar5 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_a0);
  }
  pdVar2 = (this->aveDlength_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->aveDlength_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (this->aveDlength_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  local_a0._0_8_ = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (&this->aveDlength_,this->nRBins_,(value_type_conflict2 *)local_a0);
  pdVar2 = (this->aveQlength_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->aveQlength_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (this->aveQlength_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  local_a0._0_8_ = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (local_60,this->nRBins_,(value_type_conflict2 *)local_a0);
  pdVar2 = (this->aveDcount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->aveDcount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (this->aveDcount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  local_a0._0_8_ = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (local_68,this->nRBins_,(value_type_conflict2 *)local_a0);
  pdVar2 = (this->aveQcount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->aveQcount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (this->aveQcount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  local_a0._0_8_ = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (local_70,this->nRBins_,(value_type_conflict2 *)local_a0);
  pdVar2 = (this->aveDproj_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->aveDproj_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (this->aveDproj_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  local_a0._0_8_ = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (local_78,this->nRBins_,(value_type_conflict2 *)local_a0);
  this->deltaR_ =
       this->rMax_ /
       (((double)CONCAT44(0x45300000,(int)(this->nRBins_ >> 0x20)) - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)this->nRBins_) - 4503599627370496.0));
  return;
}

Assistant:

MultipoleSum::MultipoleSum(SimInfo* info, const std::string& filename,
                             const std::string& sele1, RealType rmax,
                             int nrbins) :
      StaticAnalyser(info, filename, nrbins),
      nRBins_(nrbins), rMax_(rmax), selectionScript1_(sele1), seleMan1_(info),
      evaluator1_(info) {
    setOutputName(getPrefix(filename) + ".multipoleSum");

    evaluator1_.loadScriptString(sele1);
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    aveDlength_.clear();
    aveDlength_.resize(nRBins_, 0.0);
    aveQlength_.clear();
    aveQlength_.resize(nRBins_, 0.0);
    aveDcount_.clear();
    aveDcount_.resize(nRBins_, 0.0);
    aveQcount_.clear();
    aveQcount_.resize(nRBins_, 0.0);
    aveDproj_.clear();
    aveDproj_.resize(nRBins_, 0.0);
    deltaR_ = rMax_ / nRBins_;
  }